

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ternary_executor.hpp
# Opt level: O1

idx_t duckdb::TernaryExecutor::
      SelectLoopSelSwitch<unsigned_long,unsigned_long,unsigned_long,duckdb::BothInclusiveBetweenOperator,true>
                (UnifiedVectorFormat *adata,UnifiedVectorFormat *bdata,UnifiedVectorFormat *cdata,
                SelectionVector *sel,idx_t count,SelectionVector *true_sel,
                SelectionVector *false_sel)

{
  SelectionVector *pSVar1;
  data_ptr_t pdVar2;
  SelectionVector *pSVar3;
  data_ptr_t pdVar4;
  SelectionVector *pSVar5;
  data_ptr_t pdVar6;
  sel_t *psVar7;
  sel_t *psVar8;
  sel_t *psVar9;
  sel_t *psVar10;
  sel_t *psVar11;
  sel_t *psVar12;
  idx_t iVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  
  pSVar1 = adata->sel;
  pdVar2 = adata->data;
  pSVar3 = bdata->sel;
  pdVar4 = bdata->data;
  pSVar5 = cdata->sel;
  pdVar6 = cdata->data;
  if (false_sel == (SelectionVector *)0x0 || true_sel == (SelectionVector *)0x0) {
    if (true_sel == (SelectionVector *)0x0) {
      if (count == 0) {
        lVar19 = 0;
      }
      else {
        psVar7 = sel->sel_vector;
        psVar8 = pSVar1->sel_vector;
        psVar9 = pSVar3->sel_vector;
        psVar10 = pSVar5->sel_vector;
        psVar11 = false_sel->sel_vector;
        lVar19 = 0;
        uVar17 = 0;
        do {
          uVar18 = uVar17;
          if (psVar7 != (sel_t *)0x0) {
            uVar18 = (ulong)psVar7[uVar17];
          }
          uVar14 = uVar17;
          if (psVar8 != (sel_t *)0x0) {
            uVar14 = (ulong)psVar8[uVar17];
          }
          uVar16 = uVar17;
          if (psVar9 != (sel_t *)0x0) {
            uVar16 = (ulong)psVar9[uVar17];
          }
          uVar15 = uVar17;
          if (psVar10 != (sel_t *)0x0) {
            uVar15 = (ulong)psVar10[uVar17];
          }
          uVar14 = *(ulong *)(pdVar2 + uVar14 * 8);
          uVar16 = *(ulong *)(pdVar4 + uVar16 * 8);
          uVar15 = *(ulong *)(pdVar6 + uVar15 * 8);
          psVar11[lVar19] = (sel_t)uVar18;
          lVar19 = lVar19 + (ulong)(uVar15 < uVar14 || uVar14 < uVar16);
          uVar17 = uVar17 + 1;
        } while (count != uVar17);
      }
      return count - lVar19;
    }
    if (count != 0) {
      psVar7 = sel->sel_vector;
      psVar8 = pSVar1->sel_vector;
      psVar9 = pSVar3->sel_vector;
      psVar10 = pSVar5->sel_vector;
      psVar11 = true_sel->sel_vector;
      iVar13 = 0;
      uVar17 = 0;
      do {
        uVar18 = uVar17;
        if (psVar7 != (sel_t *)0x0) {
          uVar18 = (ulong)psVar7[uVar17];
        }
        uVar14 = uVar17;
        if (psVar8 != (sel_t *)0x0) {
          uVar14 = (ulong)psVar8[uVar17];
        }
        uVar16 = uVar17;
        if (psVar9 != (sel_t *)0x0) {
          uVar16 = (ulong)psVar9[uVar17];
        }
        uVar15 = uVar17;
        if (psVar10 != (sel_t *)0x0) {
          uVar15 = (ulong)psVar10[uVar17];
        }
        uVar14 = *(ulong *)(pdVar2 + uVar14 * 8);
        uVar16 = *(ulong *)(pdVar4 + uVar16 * 8);
        uVar15 = *(ulong *)(pdVar6 + uVar15 * 8);
        psVar11[iVar13] = (sel_t)uVar18;
        iVar13 = iVar13 + (uVar14 <= uVar15 && uVar16 <= uVar14);
        uVar17 = uVar17 + 1;
      } while (count != uVar17);
      return iVar13;
    }
  }
  else if (count != 0) {
    psVar7 = sel->sel_vector;
    psVar8 = pSVar1->sel_vector;
    psVar9 = pSVar3->sel_vector;
    psVar10 = pSVar5->sel_vector;
    psVar11 = true_sel->sel_vector;
    psVar12 = false_sel->sel_vector;
    iVar13 = 0;
    lVar19 = 0;
    uVar17 = 0;
    do {
      uVar18 = uVar17;
      if (psVar7 != (sel_t *)0x0) {
        uVar18 = (ulong)psVar7[uVar17];
      }
      uVar14 = uVar17;
      if (psVar8 != (sel_t *)0x0) {
        uVar14 = (ulong)psVar8[uVar17];
      }
      uVar16 = uVar17;
      if (psVar9 != (sel_t *)0x0) {
        uVar16 = (ulong)psVar9[uVar17];
      }
      uVar15 = uVar17;
      if (psVar10 != (sel_t *)0x0) {
        uVar15 = (ulong)psVar10[uVar17];
      }
      uVar14 = *(ulong *)(pdVar2 + uVar14 * 8);
      uVar16 = *(ulong *)(pdVar4 + uVar16 * 8);
      uVar15 = *(ulong *)(pdVar6 + uVar15 * 8);
      psVar11[iVar13] = (sel_t)uVar18;
      iVar13 = iVar13 + (uVar14 <= uVar15 && uVar16 <= uVar14);
      psVar12[lVar19] = (sel_t)uVar18;
      lVar19 = lVar19 + (ulong)(uVar14 > uVar15 || uVar16 > uVar14);
      uVar17 = uVar17 + 1;
    } while (count != uVar17);
    return iVar13;
  }
  return 0;
}

Assistant:

static inline idx_t SelectLoopSelSwitch(UnifiedVectorFormat &adata, UnifiedVectorFormat &bdata,
	                                        UnifiedVectorFormat &cdata, const SelectionVector *sel, idx_t count,
	                                        SelectionVector *true_sel, SelectionVector *false_sel) {
		if (true_sel && false_sel) {
			return SelectLoop<A_TYPE, B_TYPE, C_TYPE, OP, NO_NULL, true, true>(
			    UnifiedVectorFormat::GetData<A_TYPE>(adata), UnifiedVectorFormat::GetData<B_TYPE>(bdata),
			    UnifiedVectorFormat::GetData<C_TYPE>(cdata), sel, count, *adata.sel, *bdata.sel, *cdata.sel,
			    adata.validity, bdata.validity, cdata.validity, true_sel, false_sel);
		} else if (true_sel) {
			return SelectLoop<A_TYPE, B_TYPE, C_TYPE, OP, NO_NULL, true, false>(
			    UnifiedVectorFormat::GetData<A_TYPE>(adata), UnifiedVectorFormat::GetData<B_TYPE>(bdata),
			    UnifiedVectorFormat::GetData<C_TYPE>(cdata), sel, count, *adata.sel, *bdata.sel, *cdata.sel,
			    adata.validity, bdata.validity, cdata.validity, true_sel, false_sel);
		} else {
			D_ASSERT(false_sel);
			return SelectLoop<A_TYPE, B_TYPE, C_TYPE, OP, NO_NULL, false, true>(
			    UnifiedVectorFormat::GetData<A_TYPE>(adata), UnifiedVectorFormat::GetData<B_TYPE>(bdata),
			    UnifiedVectorFormat::GetData<C_TYPE>(cdata), sel, count, *adata.sel, *bdata.sel, *cdata.sel,
			    adata.validity, bdata.validity, cdata.validity, true_sel, false_sel);
		}
	}